

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall helics::apps::Player::runTo(Player *this,Time stopTime_input)

{
  char cVar1;
  element_type *peVar2;
  long lVar3;
  _func_int *p_Var4;
  pointer pVVar5;
  ostream *poVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  pointer pMVar10;
  pointer pVVar11;
  Time TVar12;
  bool bVar13;
  int local_3c;
  long local_38;
  
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  cVar1 = *(char *)((long)&(peVar2->super_ValueFederate).vfManager._M_t.
                           super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                           .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>.
                           _M_head_impl +
                   (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
  if (cVar1 == '\0') {
    (*(this->super_App)._vptr_App[2])(this);
  }
  else if ('\x01' < cVar1) {
    peVar2 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pVVar5 = (this->points).
             super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = *(long *)(&(peVar2->super_ValueFederate).field_0x28 +
                     (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
    uVar7 = this->pointIndex;
    uVar9 = (long)(this->points).
                  super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 7;
    if (uVar7 < uVar9) {
      pVVar5 = pVVar5 + uVar7;
      do {
        if (lVar3 < (pVVar5->time).internalTimeCode) break;
        uVar7 = uVar7 + 1;
        this->pointIndex = uVar7;
        pVVar5 = pVVar5 + 1;
      } while (uVar7 < uVar9);
    }
    uVar7 = this->messageIndex;
    pMVar10 = (this->messages).
              super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = ((long)(this->messages).
                   super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar10) / 0x110;
    if (uVar7 < uVar9) {
      pMVar10 = pMVar10 + uVar7;
      do {
        if (lVar3 < (pMVar10->sendTime).internalTimeCode) break;
        uVar7 = uVar7 + 1;
        this->messageIndex = uVar7;
        pMVar10 = pMVar10 + 1;
      } while (uVar7 < uVar9);
    }
    goto LAB_00223bf7;
  }
  sendInformation(this,(Time)0xffffffffffffffff,0);
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Federate::enterExecutingMode
            ((Federate *)
             ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),NO_ITERATIONS);
  sendInformation(this,(Time)0x0,0);
LAB_00223bf7:
  local_38 = (this->nextPrintTimeStep).internalTimeCode;
  if (local_38 < 1) {
    local_38 = 0x7fffffffffffffff;
  }
  bVar13 = true;
  iVar8 = 0;
  do {
    local_3c = 0;
LAB_00223c27:
    do {
      pVVar5 = (this->points).
               super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar11 = pVVar5 + this->pointIndex;
      pMVar10 = (this->messages).
                super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (!bVar13) goto LAB_00223d9d;
        TVar12.internalTimeCode = 0x7fffffffffffffff;
        if (this->pointIndex <
            (ulong)((long)(this->points).
                          super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 7)) {
          TVar12.internalTimeCode = (pVVar11->time).internalTimeCode;
          iVar8 = pVVar11->iteration;
        }
        if (this->messageIndex <
            (ulong)(((long)(this->messages).
                           super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar10) / 0x110)) {
          lVar3 = pMVar10[this->messageIndex].sendTime.internalTimeCode;
          if (lVar3 < TVar12.internalTimeCode) {
            TVar12.internalTimeCode = lVar3;
          }
          iVar8 = 0;
        }
        bVar13 = TVar12.internalTimeCode != 0x7fffffffffffffff;
      } while (TVar12.internalTimeCode == 0x7fffffffffffffff);
      if (stopTime_input.internalTimeCode < TVar12.internalTimeCode) {
LAB_00223d9d:
        while( true ) {
          peVar2 = (this->super_App).fed.
                   super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          p_Var4 = (peVar2->super_ValueFederate)._vptr_ValueFederate[-3];
          if (stopTime_input.internalTimeCode <=
              *(long *)(&(peVar2->super_ValueFederate).field_0x28 + (long)p_Var4)) break;
          Federate::requestTime
                    ((Federate *)
                     ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate + (long)p_Var4),
                     stopTime_input);
        }
        return;
      }
      peVar2 = (this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var4 = (peVar2->super_ValueFederate)._vptr_ValueFederate[-3];
      if ((iVar8 != 0) &&
         (TVar12.internalTimeCode <=
          *(long *)(&(peVar2->super_ValueFederate).field_0x28 + (long)p_Var4))) {
        Federate::requestTimeIterative
                  ((Federate *)
                   ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate + (long)p_Var4),TVar12,
                   FORCE_ITERATION);
        local_3c = local_3c + 1;
        sendInformation(this,TVar12,local_3c);
        goto LAB_00223c27;
      }
      TVar12 = Federate::requestTime
                         ((Federate *)
                          ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate + (long)p_Var4),
                          TVar12);
      local_3c = 0;
      sendInformation(this,TVar12,0);
    } while (TVar12.internalTimeCode < local_38);
    std::operator<<((ostream *)&std::cout,"processed for time ");
    poVar6 = std::ostream::_M_insert<double>
                       ((double)(TVar12.internalTimeCode % 1000000000) * 1e-09 +
                        (double)(TVar12.internalTimeCode / 1000000000));
    std::operator<<(poVar6,"\n");
    local_38 = local_38 + (this->nextPrintTimeStep).internalTimeCode;
  } while( true );
}

Assistant:

void Player::runTo(Time stopTime_input)
{
    auto md = fed->getCurrentMode();
    if (md == Federate::Modes::STARTUP) {
        initialize();
    }
    if (md < Federate::Modes::EXECUTING) {
        sendInformation(-Time::epsilon());

        fed->enterExecutingMode();
        // send the stuff at timeZero
        sendInformation(timeZero);
    } else {
        auto ctime = fed->getCurrentTime();
        if (isValidIndex(pointIndex, points)) {
            while (points[pointIndex].time <= ctime) {
                ++pointIndex;
                if (pointIndex >= points.size()) {
                    break;
                }
            }
        }
        if (isValidIndex(messageIndex, messages)) {
            while (messages[messageIndex].sendTime <= ctime) {
                ++messageIndex;
                if (messageIndex >= messages.size()) {
                    break;
                }
            }
        }
    }

    Time nextPrintTime = (nextPrintTimeStep > timeZero) ? nextPrintTimeStep : Time::maxVal();
    bool moreToSend{true};
    int nextIteration{0};
    int currentIteration{0};
    while (moreToSend) {
        auto nextSendTime = Time::maxVal();
        if (isValidIndex(pointIndex, points)) {
            nextSendTime = std::min(nextSendTime, points[pointIndex].time);
            nextIteration = points[pointIndex].iteration;
        }
        if (isValidIndex(messageIndex, messages)) {
            nextSendTime = std::min(nextSendTime, messages[messageIndex].sendTime);
            nextIteration = 0;
        }
        if (nextSendTime == Time::maxVal()) {
            moreToSend = false;
            continue;
        }
        if (nextSendTime > stopTime_input) {
            break;
        }

        if ((nextIteration == 0) || (nextSendTime > fed->getCurrentTime())) {
            auto newTime = fed->requestTime(nextSendTime);
            currentIteration = 0;
            sendInformation(newTime, currentIteration);

            if (newTime >= nextPrintTime) {
                std::cout << "processed for time " << static_cast<double>(newTime) << "\n";
                nextPrintTime += nextPrintTimeStep;
            }
        } else {
            fed->requestTimeIterative(nextSendTime, IterationRequest::FORCE_ITERATION);
            ++currentIteration;
            sendInformation(nextSendTime, currentIteration);
        }
    }
    while (fed->getCurrentTime() < stopTime_input) {
        fed->requestTime(stopTime_input);
    }
}